

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

size_t __thiscall libchars::editor::render(editor *this,size_t buf_idx,size_t length)

{
  edit_object *this_00;
  terminal_driver *this_01;
  int iVar1;
  int __fd;
  size_t sVar2;
  undefined4 extraout_var;
  void *__buf;
  size_t *__n;
  size_t n;
  string sequence;
  size_t length_local;
  size_t buf_idx_local;
  editor *this_local;
  
  sequence.field_2._8_8_ = length;
  std::__cxx11::string::string((string *)&n);
  this_00 = this->obj;
  sVar2 = edit_object::idx(this_00,buf_idx);
  __n = &n;
  iVar1 = (*this_00->_vptr_edit_object[0xb])(this_00,sVar2,sequence.field_2._8_8_);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    this_01 = this->driver;
    __fd = std::__cxx11::string::data();
    __buf = (void *)std::__cxx11::string::length();
    terminal_driver::write(this_01,__fd,__buf,(size_t)__n);
  }
  std::__cxx11::string::~string((string *)&n);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

size_t editor::render(size_t buf_idx, size_t length)
    {
        std::string sequence;
        size_t n = obj->render(obj->idx(buf_idx),length,sequence);
        if (n > 0)
            driver.write(sequence.data(),sequence.length());
        return n;
    }